

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

UINT GetTempFileNameW(LPCWSTR lpPathName,LPCWSTR lpPrefixString,UINT uUnique,LPWSTR lpTempFileName)

{
  long lVar1;
  int iVar2;
  DWORD DVar3;
  size_t sVar4;
  char *lpMultiByteStr;
  LPCSTR lpTempFileName_00;
  long in_FS_OFFSET;
  LPCSTR local_148;
  DWORD local_f8;
  DWORD dwLastError_2;
  DWORD dwLastError_1;
  DWORD dwLastError;
  UINT uRet;
  INT length;
  CHAR *tempfile_name;
  CHAR *prefix_string;
  CHAR *full_name;
  INT prefix_size;
  INT path_size;
  CPalThread *pThread;
  LPWSTR lpTempFileName_local;
  UINT uUnique_local;
  LPCWSTR lpPrefixString_local;
  LPCWSTR lpPathName_local;
  PathCharString prefix_stringPS;
  PathCharString full_namePS;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&prefix_stringPS.m_count);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpPathName_local);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if ((lpPathName == (LPCWSTR)0x0) || (*lpPathName == L'\0')) {
    CorUnix::CPalThread::SetLastError(0x10b);
    dwLastError_1 = 0;
  }
  else {
    sVar4 = PAL_wcslen(lpPathName);
    iVar2 = ((int)sVar4 + 1) * MaxWCharToAcpLengthFactor;
    lpMultiByteStr =
         StackString<32UL,_char>::OpenStringBuffer
                   ((StackString<32UL,_char> *)&prefix_stringPS.m_count,(long)iVar2);
    if (lpMultiByteStr == (char *)0x0) {
      CorUnix::CPalThread::SetLastError(8);
      dwLastError_1 = 0;
    }
    else {
      iVar2 = WideCharToMultiByte(0,0,lpPathName,-1,lpMultiByteStr,iVar2,(LPCSTR)0x0,(LPBOOL)0x0);
      StackString<32UL,_char>::CloseBuffer
                ((StackString<32UL,_char> *)&prefix_stringPS.m_count,(long)iVar2);
      if (iVar2 == 0) {
        DVar3 = GetLastError();
        if (DVar3 == 0x7a) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          CorUnix::CPalThread::SetLastError(0xce);
        }
        else {
          fprintf(_stderr,"] %s %s:%d","GetTempFileNameW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                  ,0xe81);
          fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
          CorUnix::CPalThread::SetLastError(0x54f);
        }
        dwLastError_1 = 0;
      }
      else {
        if (lpPrefixString != (LPCWSTR)0x0) {
          sVar4 = PAL_wcslen(lpPrefixString);
          tempfile_name =
               StackString<32UL,_char>::OpenStringBuffer
                         ((StackString<32UL,_char> *)&lpPathName_local,
                          (long)(((int)sVar4 + 1) * MaxWCharToAcpLengthFactor));
          if (tempfile_name == (char *)0x0) {
            CorUnix::CPalThread::SetLastError(8);
            dwLastError_1 = 0;
            goto LAB_0039a026;
          }
          iVar2 = WideCharToMultiByte(0,0,lpPrefixString,-1,tempfile_name,0x3f8 - iVar2,(LPCSTR)0x0,
                                      (LPBOOL)0x0);
          StackString<32UL,_char>::CloseBuffer
                    ((StackString<32UL,_char> *)&lpPathName_local,(long)iVar2);
          if (iVar2 == 0) {
            DVar3 = GetLastError();
            if (DVar3 == 0x7a) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              CorUnix::CPalThread::SetLastError(0xce);
            }
            else {
              fprintf(_stderr,"] %s %s:%d","GetTempFileNameW",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                      ,0xea2);
              fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar3);
              CorUnix::CPalThread::SetLastError(0x54f);
            }
            dwLastError_1 = 0;
            goto LAB_0039a026;
          }
        }
        lpTempFileName_00 = (LPCSTR)CorUnix::InternalMalloc(0x400);
        if (lpTempFileName_00 == (LPCSTR)0x0) {
          CorUnix::CPalThread::SetLastError(8);
          dwLastError_1 = 0;
        }
        else {
          if (lpPrefixString == (LPCWSTR)0x0) {
            local_148 = (LPCSTR)0x0;
          }
          else {
            local_148 = tempfile_name;
          }
          dwLastError_1 = GetTempFileNameA(lpMultiByteStr,local_148,0,lpTempFileName_00);
          if (dwLastError_1 != 0) {
            iVar2 = MultiByteToWideChar(0,0,lpTempFileName_00,-1,lpTempFileName,0x400);
            CorUnix::InternalFree(lpTempFileName_00);
            if (iVar2 == 0) {
              DVar3 = GetLastError();
              if (DVar3 == 0x7a) {
                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                  abort();
                }
                local_f8 = 0xce;
              }
              else {
                fprintf(_stderr,"] %s %s:%d","GetTempFileNameW",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                        ,0xec6);
                fprintf(_stderr,"MultiByteToWideChar failure! error is %d",(ulong)DVar3);
                local_f8 = 0x54f;
              }
              CorUnix::CPalThread::SetLastError(local_f8);
              dwLastError_1 = 0;
            }
          }
        }
      }
    }
  }
LAB_0039a026:
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpPathName_local);
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&prefix_stringPS.m_count);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return dwLastError_1;
}

Assistant:

UINT
PALAPI
GetTempFileNameW(
         IN LPCWSTR lpPathName,
         IN LPCWSTR lpPrefixString,
         IN UINT uUnique,
         OUT LPWSTR lpTempFileName)
{
    CPalThread *pThread;
    INT path_size = 0;
    INT prefix_size = 0;
    CHAR * full_name;
    CHAR * prefix_string;
    CHAR * tempfile_name;
    PathCharString full_namePS, prefix_stringPS;
    INT length = 0;
    UINT   uRet;

    PERF_ENTRY(GetTempFileNameW);
    ENTRY("GetTempFileNameW(lpPathName=%p (%S), lpPrefixString=%p (%S), uUnique=%u, "
          "lpTempFileName=%p)\n", lpPathName?lpPathName:W16_NULLSTRING, lpPathName?lpPathName:W16_NULLSTRING,
          lpPrefixString?lpPrefixString:W16_NULLSTRING,
          lpPrefixString?lpPrefixString:W16_NULLSTRING,uUnique, lpTempFileName);

    pThread = InternalGetCurrentThread();
    /* Sanity checks. */
    if ( !lpPathName || *lpPathName == '\0' )
    {
        pThread->SetLastError( ERROR_DIRECTORY );
        uRet = 0;
        goto done;
    }

    length = (PAL_wcslen(lpPathName)+1) * MaxWCharToAcpLengthFactor;
    full_name = full_namePS.OpenStringBuffer(length);
    if (NULL == full_name)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        uRet = 0;
        goto done;
    }
    path_size = WideCharToMultiByte( CP_ACP, 0, lpPathName, -1, full_name,
                                     length, NULL, NULL );
    full_namePS.CloseBuffer(path_size);
                                     
    if( path_size == 0 )
    {
        DWORD dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            pThread->SetLastError(ERROR_INTERNAL_ERROR);
        }
        uRet = 0;
        goto done;
    }
    
    if (lpPrefixString != NULL) 
    {
        length = (PAL_wcslen(lpPrefixString)+1) * MaxWCharToAcpLengthFactor;
        prefix_string = prefix_stringPS.OpenStringBuffer(length);
        if (NULL == prefix_string)
        {
            pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
            uRet = 0;
            goto done;
        }
        prefix_size = WideCharToMultiByte( CP_ACP, 0, lpPrefixString, -1, 
                                           prefix_string,
                                           MAX_LONGPATH - path_size - MAX_SEEDSIZE, 
                                           NULL, NULL );
        prefix_stringPS.CloseBuffer(prefix_size);
        
        if( prefix_size == 0 )
        {
            DWORD dwLastError = GetLastError();
            if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
            {
                WARN("Full name would be larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
                pThread->SetLastError(ERROR_FILENAME_EXCED_RANGE);
            }
            else
            {
                ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
                pThread->SetLastError(ERROR_INTERNAL_ERROR);
            }
            uRet = 0;
            goto done;
        }
    }
    
    tempfile_name = (char*)InternalMalloc(MAX_LONGPATH);
    if (tempfile_name == NULL)
    {
        pThread->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        uRet = 0;
        goto done;
    }
    
    uRet = GetTempFileNameA(full_name, 
                            (lpPrefixString == NULL) ? NULL : prefix_string,
                            0, tempfile_name);
    if (uRet)
    {                    
        path_size = MultiByteToWideChar( CP_ACP, 0, tempfile_name, -1, 
                                           lpTempFileName, MAX_LONGPATH );

        InternalFree(tempfile_name);
        tempfile_name = NULL;
        if (!path_size)
        {
            DWORD dwLastError = GetLastError();
            if (dwLastError == ERROR_INSUFFICIENT_BUFFER)
            {
                WARN("File names larger than MAX_PATH_FNAME (%d)! \n", MAX_LONGPATH);
                dwLastError = ERROR_FILENAME_EXCED_RANGE;
            }
            else
            {
                ASSERT("MultiByteToWideChar failure! error is %d", dwLastError);     
                dwLastError = ERROR_INTERNAL_ERROR;
            }
            pThread->SetLastError(dwLastError);
            uRet = 0;
        }
    }

done:
    LOGEXIT("GetTempFileNameW returns UINT %u\n", uRet);
    PERF_EXIT(GetTempFileNameW);
    return uRet;
}